

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

void fy_node_apply(fy_node *fyn,fy_node_applyf func)

{
  byte bVar1;
  fy_token *pfVar2;
  
  if (func != (fy_node_applyf)0x0 && fyn != (fy_node *)0x0) {
    (*func)(fyn);
    bVar1 = fyn->field_0x34 & 3;
    if (bVar1 == 2) {
      pfVar2 = (fyn->field_12).scalar;
      if (pfVar2 != (fy_token *)0x0 && pfVar2 != (fy_token *)&fyn->field_12) {
        do {
          fy_node_apply(*(fy_node **)&pfVar2->type,func);
          fy_node_apply(*(fy_node **)&pfVar2->analyze_flags,func);
          pfVar2 = (fy_token *)(pfVar2->node).next;
          if (pfVar2 == (fy_token *)&fyn->field_12) {
            pfVar2 = (fy_token *)0x0;
          }
        } while (pfVar2 != (fy_token *)0x0);
      }
    }
    else if (bVar1 == 1) {
      pfVar2 = (fyn->field_12).scalar;
      if (pfVar2 != (fy_token *)0x0 && pfVar2 != (fy_token *)&fyn->field_12) {
        do {
          fy_node_apply((fy_node *)pfVar2,func);
          pfVar2 = (fy_token *)(pfVar2->node).next;
          if (pfVar2 == (fy_token *)&fyn->field_12) {
            pfVar2 = (fy_token *)0x0;
          }
        } while (pfVar2 != (fy_token *)0x0);
      }
    }
  }
  return;
}

Assistant:

void fy_node_apply(struct fy_node *fyn, fy_node_applyf func) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;

    if (!fyn || !func)
        return;

    (*func)(fyn);

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni))
                fy_node_apply(fyni, func);
            break;

        case FYNT_MAPPING:
            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn->mapping, fynp)) {

                fy_node_apply(fynp->key, func);
                fy_node_apply(fynp->value, func);
            }
            break;
    }
}